

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20250127::SetLogBacktraceLocation(string_view file,int line)

{
  size_t sVar1;
  int in_ECX;
  string_view file_00;
  int line_local;
  string_view file_local;
  memory_order __b;
  
  file_00._M_len = file._M_str;
  file_00._M_str._0_4_ = line;
  file_00._M_str._4_4_ = 0;
  sVar1 = anon_unknown_1::HashSiteForLogBacktraceAt((anon_unknown_1 *)file._M_len,file_00,in_ECX);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (anonymous_namespace)::log_backtrace_at_hash = sVar1;
  return;
}

Assistant:

void SetLogBacktraceLocation(absl::string_view file, int line) {
  log_backtrace_at_hash.store(HashSiteForLogBacktraceAt(file, line),
                              std::memory_order_relaxed);
}